

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure_test.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  debugging_options *pdVar1;
  initializer_list<bool> __l;
  undefined2 local_18c;
  allocator_type local_18a;
  allocator local_189;
  _Bvector_base<std::allocator<bool>_> local_188;
  string local_160;
  TestSuite ts;
  code *local_e8 [2];
  code *local_d8;
  code *local_d0;
  code *local_c8 [2];
  code *local_b8;
  code *local_b0;
  code *local_a8 [2];
  code *local_98;
  code *local_90;
  code *local_88 [2];
  code *local_78;
  code *local_70;
  code *local_68 [2];
  code *local_58;
  code *local_50;
  TestRange<bool> local_48;
  
  TestSuite::TestSuite(&ts,argc,argv);
  ts.options.printTestMessage = true;
  pdVar1 = nuraft::debugging_options::get_instance();
  LOCK();
  (pdVar1->disable_reconn_backoff_)._M_base._M_i = true;
  UNLOCK();
  std::__cxx11::string::string((string *)&local_188,"simple conflict test",(allocator *)&local_18c);
  local_68[1] = (code *)0x0;
  local_68[0] = failure_test::simple_conflict_test;
  local_50 = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_58 = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&ts,(string *)&local_188,(test_func *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string
            ((string *)&local_160,"remove not responding server with quorum test",&local_189);
  local_18c = 0x100;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_18c;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_188,__l,&local_18a);
  TestRange<bool>::TestRange(&local_48,(vector<bool,_std::allocator<bool>_> *)&local_188);
  TestSuite::doTest<bool,int(*)(bool)>
            (&ts,&local_160,failure_test::rmv_not_resp_srv_wq_test,&local_48);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&local_48.array.super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_188);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string
            ((string *)&local_188,"force log compaction test",(allocator *)&local_18c);
  local_88[1] = (code *)0x0;
  local_88[0] = failure_test::force_log_compaction_test;
  local_70 = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_78 = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&ts,(string *)&local_188,(test_func *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string
            ((string *)&local_188,"uncommitted config for new leader test",(allocator *)&local_18c);
  local_a8[1] = (code *)0x0;
  local_a8[0] = failure_test::uncommitted_conf_new_leader_test;
  local_90 = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_98 = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&ts,(string *)&local_188,(test_func *)local_a8);
  std::_Function_base::~_Function_base((_Function_base *)local_a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string
            ((string *)&local_188,"removed server late step down test",(allocator *)&local_18c);
  local_c8[1] = (code *)0x0;
  local_c8[0] = failure_test::removed_server_late_step_down_test;
  local_b0 = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_b8 = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&ts,(string *)&local_188,(test_func *)local_c8);
  std::_Function_base::~_Function_base((_Function_base *)local_c8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string
            ((string *)&local_188,"remove server on pending configs test",(allocator *)&local_18c);
  local_e8[1] = (code *)0x0;
  local_e8[0] = failure_test::remove_server_on_pending_configs_test;
  local_d0 = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_d8 = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&ts,(string *)&local_188,(test_func *)local_e8);
  std::_Function_base::~_Function_base((_Function_base *)local_e8);
  std::__cxx11::string::~string((string *)&local_188);
  TestSuite::~TestSuite(&ts);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite ts(argc, argv);

    ts.options.printTestMessage = true;

    // Disable reconnection timer for deterministic test.
    debugging_options::get_instance().disable_reconn_backoff_ = true;

    ts.doTest( "simple conflict test",
               simple_conflict_test );

    ts.doTest( "remove not responding server with quorum test",
               rmv_not_resp_srv_wq_test,
               TestRange<bool>({false, true}) );

    ts.doTest( "force log compaction test",
               force_log_compaction_test );

    ts.doTest( "uncommitted config for new leader test",
               uncommitted_conf_new_leader_test );

    ts.doTest( "removed server late step down test",
               removed_server_late_step_down_test );

    ts.doTest( "remove server on pending configs test",
               remove_server_on_pending_configs_test );

    return 0;
}